

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O1

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  int iVar1;
  CardinalityInterface *__p;
  ostream *poVar2;
  FailureReporterInterface *pFVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Cardinality CVar4;
  stringstream ss;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  __p = (CardinalityInterface *)operator_new(0x10);
  __p->_vptr_CardinalityInterface = (_func_int **)&PTR__CardinalityInterface_00160b18;
  iVar1 = 0;
  if (0 < min) {
    iVar1 = min;
  }
  *(int *)&__p[1]._vptr_CardinalityInterface = iVar1;
  if (iVar1 <= max) {
    iVar1 = max;
  }
  *(int *)((long)&__p[1]._vptr_CardinalityInterface + 4) = iVar1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (min < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation lower bound must be >= 0, ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"but is actually ",0x10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    std::__cxx11::stringbuf::str();
    pFVar3 = internal::GetFailureReporter();
    (*pFVar3->_vptr_FailureReporterInterface[2])
              (pFVar3,0,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O1/googletest-src/googlemock/src/gmock-cardinalities.cc"
               ,0x3a,local_1d0);
  }
  else if (max < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation upper bound must be >= 0, ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"but is actually ",0x10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    std::__cxx11::stringbuf::str();
    pFVar3 = internal::GetFailureReporter();
    (*pFVar3->_vptr_FailureReporterInterface[2])
              (pFVar3,0,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O1/googletest-src/googlemock/src/gmock-cardinalities.cc"
               ,0x3e,local_1d0);
  }
  else {
    if (min <= max) goto LAB_0010e838;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation upper bound (",0x1c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,max);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,") must be >= the invocation lower bound (",0x29);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,").",2);
    std::__cxx11::stringbuf::str();
    pFVar3 = internal::GetFailureReporter();
    (*pFVar3->_vptr_FailureReporterInterface[2])
              (pFVar3,0,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O1/googletest-src/googlemock/src/gmock-cardinalities.cc"
               ,0x42,local_1d0);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
LAB_0010e838:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  *(CardinalityInterface **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::CardinalityInterface_const*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  CVar4.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  CVar4.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Cardinality)
         CVar4.impl_.
         super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}